

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oarchive_suite.cpp
# Opt level: O2

void optional_suite::test_value(void)

{
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> value;
  oarchive ar;
  ostringstream result;
  string local_230 [32];
  optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_210;
  basic_oarchive<char> local_1e8;
  ostringstream local_180 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_180);
  trial::protocol::json::basic_oarchive<char>::basic_oarchive<std::__cxx11::ostringstream>
            (&local_1e8,
             (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180);
  boost::optional_detail::optional_base<std::__cxx11::string>::
  optional_base<char_const(&)[6],char[6]>(&local_210,(char (*) [6])"alpha",(char (*) [6])"alpha");
  trial::protocol::json::basic_oarchive<char>::save_override<boost::optional<std::__cxx11::string>>
            (&local_1e8,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_210);
  std::__cxx11::stringbuf::str();
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[8]>
            ("result.str()","\"\\\"alpha\\\"\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/oarchive_suite.cpp"
             ,0x166,"void optional_suite::test_value()",local_230,"\"alpha\"");
  std::__cxx11::string::~string(local_230);
  boost::optional_detail::
  optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional_base(&local_210);
  trial::protocol::json::basic_oarchive<char>::~basic_oarchive(&local_1e8);
  std::__cxx11::ostringstream::~ostringstream(local_180);
  return;
}

Assistant:

void test_value()
{
    std::ostringstream result;
    json::oarchive ar(result);
    boost::optional<std::string> value("alpha");
    ar << value;
    TRIAL_PROTOCOL_TEST_EQUAL(result.str(), "\"alpha\"");
}